

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fftnd.c
# Opt level: O0

void kiss_fftnd(kiss_fftnd_cfg st,kiss_fft_cpx *fin,kiss_fft_cpx *fout)

{
  int iVar1;
  kiss_fft_cpx *in_RDX;
  kiss_fft_cpx *in_RSI;
  int *in_RDI;
  int stride;
  int curdim;
  kiss_fft_cpx *bufout;
  kiss_fft_cpx *bufin;
  int k;
  int i;
  int in_stride;
  kiss_fft_cpx *pkVar2;
  int iVar3;
  int iVar4;
  
  pkVar2 = in_RDX;
  if ((in_RDI[1] & 1U) == 0) {
    pkVar2 = *(kiss_fft_cpx **)(in_RDI + 6);
  }
  else if (in_RSI == in_RDX) {
    memcpy(*(void **)(in_RDI + 6),in_RSI,(long)*in_RDI << 3);
    in_RSI = *(kiss_fft_cpx **)(in_RDI + 6);
  }
  for (iVar3 = 0; iVar3 < in_RDI[1]; iVar3 = iVar3 + 1) {
    in_stride = *(int *)(*(long *)(in_RDI + 2) + (long)iVar3 * 4);
    iVar1 = *in_RDI / in_stride;
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      kiss_fft_stride((kiss_fft_cfg)CONCAT44(iVar4,iVar3),in_RSI,pkVar2,in_stride);
    }
    if (pkVar2 == *(kiss_fft_cpx **)(in_RDI + 6)) {
      pkVar2 = in_RDX;
      in_RSI = *(kiss_fft_cpx **)(in_RDI + 6);
    }
    else {
      pkVar2 = *(kiss_fft_cpx **)(in_RDI + 6);
      in_RSI = in_RDX;
    }
  }
  return;
}

Assistant:

void kiss_fftnd(kiss_fftnd_cfg st,const kiss_fft_cpx *fin,kiss_fft_cpx *fout)
{
    int i,k;
    const kiss_fft_cpx * bufin=fin;
    kiss_fft_cpx * bufout;

    /*arrange it so the last bufout == fout*/
    if ( st->ndims & 1 ) {
        bufout = fout;
        if (fin==fout) {
            memcpy( st->tmpbuf, fin, sizeof(kiss_fft_cpx) * st->dimprod );
            bufin = st->tmpbuf;
        }
    }else
        bufout = st->tmpbuf;

    for ( k=0; k < st->ndims; ++k) {
        int curdim = st->dims[k];
        int stride = st->dimprod / curdim;

        for ( i=0 ; i<stride ; ++i ) 
            kiss_fft_stride( st->states[k], bufin+i , bufout+i*curdim, stride );

        /*toggle back and forth between the two buffers*/
        if (bufout == st->tmpbuf){
            bufout = fout;
            bufin = st->tmpbuf;
        }else{
            bufout = st->tmpbuf;
            bufin = fout;
        }
    }
}